

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool gen_load(DisasContext_conflict12 *ctx,arg_lb *a,MemOp memop)

{
  TCGContext_conflict11 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 val;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict11 *tcg_ctx;
  MemOp memop_local;
  arg_lb *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  val = tcg_temp_new_i64(tcg_ctx_00);
  gen_get_gpr(tcg_ctx_00,t,a->rs1);
  tcg_gen_addi_i64_riscv64(tcg_ctx_00,t,t,(long)a->imm);
  tcg_gen_qemu_ld_i64_riscv64(tcg_ctx_00,val,t,(ulong)ctx->mem_idx,memop);
  gen_set_gpr(tcg_ctx_00,a->rd,val);
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,val);
  return true;
}

Assistant:

static inline TCGv gen_load(DisasContext *s, int opsize, TCGv addr,
                            int sign, int index)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;
    tmp = tcg_temp_new_i32(tcg_ctx);
    switch(opsize) {
    case OS_BYTE:
        if (sign)
            tcg_gen_qemu_ld8s(tcg_ctx, tmp, addr, index);
        else
            tcg_gen_qemu_ld8u(tcg_ctx, tmp, addr, index);
        break;
    case OS_WORD:
        if (sign)
            tcg_gen_qemu_ld16s(tcg_ctx, tmp, addr, index);
        else
            tcg_gen_qemu_ld16u(tcg_ctx, tmp, addr, index);
        break;
    case OS_LONG:
        tcg_gen_qemu_ld32u(tcg_ctx, tmp, addr, index);
        break;
    default:
        g_assert_not_reached();
    }
    return tmp;
}